

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_base::element::element(element *this,element *other)

{
  uint *in_RSI;
  uint *in_RDI;
  basic_message<char> *other_00;
  basic_message<char> *in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RDI & 0xfffffffe | *in_RSI & 1;
  *in_RDI = *in_RDI & 1 | *in_RSI & 0xfffffffe;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)(in_RSI + 2));
  other_00 = (basic_message<char> *)(in_RDI + 10);
  std::__cxx11::string::string((string *)other_00,(string *)(in_RSI + 10));
  booster::locale::basic_message<char>::basic_message(in_stack_ffffffffffffffe0,other_00);
  booster::copy_ptr<cppcms::widgets::select_base::element::_data>::copy_ptr
            ((copy_ptr<cppcms::widgets::select_base::element::_data> *)(in_RDI + 0x32));
  return;
}

Assistant:

select_base::element::element(select_base::element const &other) : 
	need_translation(other.need_translation),
	reserved(other.reserved),
	id(other.id),
	str_option(other.str_option),
	tr_option(other.tr_option)
{
}